

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QPlatformTextureListWatcher::onLockStatusChanged(QPlatformTextureListWatcher *this,bool locked)

{
  bool bVar1;
  bool *pbVar2;
  long in_FS_OFFSET;
  QPlatformTextureList *tl;
  QPlatformTextureList *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (QPlatformTextureList *)QObject::sender();
  pbVar2 = QHash<QPlatformTextureList_*,_bool>::operator[]
                     ((QHash<QPlatformTextureList_*,_bool> *)(this + 0x10),&local_20);
  *pbVar2 = locked;
  bVar1 = isLocked(this);
  if (!bVar1) {
    QWidgetRepaintManager::sync(*(QWidgetRepaintManager **)(this + 0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void onLockStatusChanged(bool locked) {
        QPlatformTextureList *tl = static_cast<QPlatformTextureList *>(sender());
        m_locked[tl] = locked;
        if (!isLocked())
            m_repaintManager->sync();
     }